

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaMIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  TiledRgbaOutputFile *this;
  int iVar1;
  int iVar2;
  int xLevel;
  int yMax;
  int in_ECX;
  float in_EDX;
  float in_ESI;
  Compression in_R8D;
  size_t in_stack_00000078;
  size_t in_stack_00000080;
  int level;
  TiledRgbaOutputFile *in_stack_00000090;
  Array2D<Imf_2_5::Rgba> pixels;
  TiledRgbaOutputFile out;
  int in_stack_ffffffffffffff1c;
  int dyMax;
  int in_stack_ffffffffffffff24;
  int iVar3;
  int in_stack_ffffffffffffff2c;
  TiledRgbaOutputFile *this_00;
  int xMax;
  int in_stack_ffffffffffffff3c;
  int h;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffffa0;
  int yLevel;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  TiledRgbaOutputFile *in_stack_ffffffffffffffb0;
  LevelMode in_stack_ffffffffffffffc0;
  LevelRoundingMode in_stack_ffffffffffffffc8;
  RgbaChannels in_stack_ffffffffffffffd0;
  ToYa *in_stack_ffffffffffffffd8;
  LineOrder in_stack_ffffffffffffffe0;
  Compression compression;
  float numThreads;
  
  this_00 = (TiledRgbaOutputFile *)&stack0xffffffffffffffc8;
  compression = in_R8D;
  numThreads = in_EDX;
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)this_00,0.0,0.0);
  iVar1 = Imf_2_5::globalThreadCount();
  h = 3;
  xMax = 0;
  dyMax = 0;
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
             in_stack_ffffffffffffffa0,in_R8D,in_ECX,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,in_EDX,
             (V2f *)in_stack_ffffffffffffffd8,in_ESI,in_stack_ffffffffffffffe0,compression,
             (int)numThreads);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&stack0xffffffffffffffb0,0);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
            (in_stack_00000090,_level,in_stack_00000080,in_stack_00000078);
  yLevel = 0;
  while( true ) {
    iVar3 = yLevel;
    iVar2 = Imf_2_5::TiledRgbaOutputFile::numLevels((TiledRgbaOutputFile *)0x117a5d);
    if (iVar2 <= yLevel) break;
    Imf_2_5::TiledRgbaOutputFile::levelWidth
              ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff24,dyMax),
               in_stack_ffffffffffffff1c);
    xLevel = Imf_2_5::TiledRgbaOutputFile::levelHeight
                       ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff24,dyMax),
                        in_stack_ffffffffffffff1c);
    Imf_2_5::TiledRgbaOutputFile::levelWidth
              ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff24,dyMax),
               in_stack_ffffffffffffff1c);
    this = (TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff24,dyMax);
    dyMax = iVar3;
    yMax = Imf_2_5::TiledRgbaOutputFile::levelHeight(this,in_stack_ffffffffffffff1c);
    iVar3 = dyMax;
    iVar2 = dyMax;
    drawImage4((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_ffffffffffffff4c,iVar1),
               in_stack_ffffffffffffff44,h,in_stack_ffffffffffffff3c,xMax,
               (int)((ulong)this_00 >> 0x20),yMax,xLevel,yLevel);
    Imf_2_5::TiledRgbaOutputFile::numXTiles
              ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff24,dyMax),
               in_stack_ffffffffffffff1c);
    Imf_2_5::TiledRgbaOutputFile::numYTiles
              ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff24,dyMax),
               in_stack_ffffffffffffff1c);
    Imf_2_5::TiledRgbaOutputFile::writeTiles
              (this_00,in_stack_ffffffffffffff2c,iVar3,in_stack_ffffffffffffff24,dyMax,
               in_stack_ffffffffffffff1c);
    yLevel = iVar2 + 1;
  }
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_ffffffffffffff24,dyMax));
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(this_00);
  return;
}

Assistant:

void
writeTiledRgbaMIP1 (const char fileName[],
                    int width, int height,
                    int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (fileName,
                             width, height,		// image size
                             tileWidth, tileHeight,	// tile size
                             MIPMAP_LEVELS,		// level mode
			     ROUND_DOWN,		// rounding mode
                             WRITE_RGBA);		// channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        drawImage4 (pixels,
		    out.levelWidth (level), out.levelHeight (level),
                    0, out.levelWidth (level),
		    0, out.levelHeight (level),
                    level, level);

	out.writeTiles (0, out.numXTiles (level) - 1,
			0, out.numYTiles (level) - 1,
			level);
    }
}